

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
__thiscall
duckdb::EnumColumnWriter::InitializePageState
          (EnumColumnWriter *this,PrimitiveColumnWriterState *state,idx_t page_idx)

{
  undefined8 in_RAX;
  undefined8 local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::EnumWriterPageState,unsigned_int&>
            ((duckdb *)&local_18,
             (uint *)((long)&(state->super_ColumnWriterState).repetition_levels.
                             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  *(undefined8 *)this = local_18;
  return (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
          )(unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )this;
}

Assistant:

unique_ptr<ColumnWriterPageState> EnumColumnWriter::InitializePageState(PrimitiveColumnWriterState &state,
                                                                        idx_t page_idx) {
	return make_uniq<EnumWriterPageState>(bit_width);
}